

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spp.cpp
# Opt level: O3

int __thiscall
SPP::solveSPP(SPP *this,Satellite **GPSPosAndVel,Satellite **BDSPosAndVel,Obs **GPSObs,Obs **BDSObs,
             Ephemeris **GPSEph,Ephemeris **BDSEph,ELLIPSOID type)

{
  undefined8 *puVar1;
  Satellite *pSVar2;
  bool bVar3;
  XYZ SatPosition;
  XYZ station;
  XYZ SatPosition_00;
  XYZ station_00;
  XYZ obj;
  XYZ obj_00;
  Vector3d b;
  Vector3d b_00;
  Vector3d a;
  Vector3d a_00;
  SPP *pSVar4;
  ulong uVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  XYZ *pXVar9;
  long lVar10;
  ulong uVar11;
  int i;
  uint row;
  Satellite **ppSVar12;
  long lVar13;
  uint uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  MatrixXd tmp2;
  MatrixXd B_T;
  MatrixXd tmp1;
  int flag;
  XYZ NEU;
  MatrixXd w;
  MatrixXd P;
  MatrixXd B;
  MatrixXd v;
  MatrixXd tmp5;
  MatrixXd tmp4;
  MatrixXd tmp3;
  MatrixXd tmp10;
  MatrixXd tmp9;
  MatrixXd tmp8;
  MatrixXd tmp7;
  MatrixXd tmp6;
  double in_stack_fffffffffffffdc8;
  double *in_stack_fffffffffffffdd0;
  double in_stack_fffffffffffffdd8;
  double *in_stack_fffffffffffffde0;
  Matrix<double,__1,__1> local_1f8;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  double local_1d0;
  Matrix<double,_3,_1> local_1c8;
  XYZ local_1b8;
  SPP *local_1a0;
  Matrix<double,__1,__1> local_198;
  double local_188;
  Satellite **local_180;
  int local_178;
  int local_174;
  ulong local_170;
  double local_168;
  double local_160;
  double local_158;
  Satellite **local_150;
  XYZ local_148;
  Matrix<double,_3,_1> local_130;
  Matrix<double,__1,__1> local_120;
  Matrix<double,__1,__1> local_110;
  Matrix<double,__1,__1> local_100;
  ulong local_f0;
  Obs **local_e8;
  Obs **local_e0;
  Matrix<double,__1,__1> local_d8;
  Matrix<double,__1,__1> local_c8;
  Matrix<double,__1,__1> local_b8;
  Matrix<double,__1,__1> local_a8;
  double local_98;
  ulong local_90;
  double local_88;
  Matrix<double,__1,__1> local_80;
  Matrix<double,__1,__1> local_70;
  Matrix<double,__1,__1> local_60;
  Matrix<double,__1,__1> local_50;
  Matrix<double,__1,__1> local_40;
  
  iVar19 = 0;
  iVar20 = 0;
  lVar7 = 0x148;
  do {
    iVar19 = iVar19 + (uint)(*(double *)((long)&(*GPSPosAndVel)[-1].SatPosition.X + lVar7) != -1.0);
    iVar20 = iVar20 + (uint)(*(double *)((long)&((*GPSPosAndVel)->SatPosition).X + lVar7) != -1.0);
    lVar7 = lVar7 + 0x170;
  } while (lVar7 != 0x1848);
  uVar21 = iVar20 + iVar19;
  uVar11 = (ulong)uVar21;
  iVar19 = 0;
  iVar20 = 0;
  lVar7 = 0x148;
  do {
    iVar19 = iVar19 + (uint)(*(double *)((long)&(*BDSPosAndVel)[-1].SatPosition.X + lVar7) != -1.0);
    iVar20 = iVar20 + (uint)(*(double *)((long)&((*BDSPosAndVel)->SatPosition).X + lVar7) != -1.0);
    lVar7 = lVar7 + 0x170;
  } while (lVar7 != 0x2f48);
  uVar14 = iVar20 + iVar19;
  local_170 = (ulong)uVar14;
  (this->result).BDSObsNum = uVar14;
  (this->result).GPSObsNum = uVar21;
  iVar19 = 1;
  if (((uVar14 != 0 || 4 < uVar21) && (4 < uVar14 || uVar21 != 0)) &&
     ((row = uVar14 + uVar21, uVar21 == 0 || ((uVar14 == 0 || (4 < row)))))) {
    bVar3 = uVar21 == 0 || uVar14 == 0;
    local_1c8.rows = 3;
    local_1c8.cols = 1;
    local_1a0 = this;
    local_180 = BDSPosAndVel;
    local_e8 = GPSObs;
    local_e0 = BDSObs;
    local_1c8.data = (double *)operator_new__(0x18);
    Matrix<double,_3,_1>::Zero(&local_1c8);
    Matrix<double,_-1,_-1>::Matrix(&local_100,row,bVar3 ^ 5);
    Matrix<double,_-1,_-1>::Matrix(&local_110,local_100.rows,local_100.rows);
    Matrix<double,_-1,_-1>::Matrix(&local_120,local_100.rows,1);
    Matrix<double,_-1,_-1>::Zero(&local_100);
    Matrix<double,_-1,_-1>::Zero(&local_110);
    local_160 = (local_1a0->result).GPSR;
    local_98 = (double)(int)(bVar3 + row + -5);
    local_178 = 4 - (uint)(uVar21 == 0);
    local_168 = (local_1a0->result).BDSR;
    uVar5 = 0;
    ppSVar12 = local_180;
    local_150 = GPSPosAndVel;
    local_f0 = uVar11;
    do {
      local_90 = uVar5;
      XYZ::XYZ(&local_148);
      uVar5 = (ulong)local_1e8 >> 0x20;
      local_1e8 = (double)(uVar5 << 0x20);
      if ((int)uVar11 != 0) {
        lVar8 = 0;
        lVar13 = 0x670;
        lVar10 = 0;
        local_1e8 = (double)(uVar5 << 0x20);
        lVar7 = 500;
        do {
          pSVar4 = local_1a0;
          dVar16 = *(double *)((long)&(*GPSPosAndVel)->n + lVar10);
          if ((dVar16 != -1.0) || (NAN(dVar16))) {
            puVar1 = (undefined8 *)((long)(*local_e8)->psr + lVar8 + -0x10);
            dVar16 = (double)puVar1[1];
            *(undefined8 *)&(local_1a0->result).ObsTime = *puVar1;
            (local_1a0->result).ObsTime.SOW = dVar16;
            pXVar9 = &local_1b8;
            XYZ::XYZ(&local_1b8);
            pSVar2 = *local_150;
            SatPosition.Z = *(double *)((long)&(pSVar2->SatPosition).Z + lVar10);
            SatPosition._0_16_ = *(undefined1 (*) [16])((long)&(pSVar2->SatPosition).X + lVar10);
            EarthRotationFix((SPP *)pXVar9,*(double *)((long)&pSVar2->deltat + lVar10),SatPosition,
                             GPS,&local_1b8);
            *(double *)((long)&(pSVar4->result).UserPositionXYZ.X + lVar13) = local_1b8.Z;
            pdVar6 = (double *)((long)&(pSVar4->result).ObsTime.Week + lVar13);
            *pdVar6 = local_1b8.X;
            pdVar6[1] = local_1b8.Y;
            local_1f8.rows = 3;
            local_1f8.cols = 1;
            pdVar6 = (double *)operator_new__(0x18);
            local_1f8.data = pdVar6;
            dVar16 = local_1b8.X;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,0,0);
            *pdVar6 = dVar16;
            dVar16 = local_1b8.Y;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,1,0);
            dVar15 = local_1b8.Z;
            *pdVar6 = dVar16;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,2,0);
            *pdVar6 = dVar15;
            a.data = in_stack_fffffffffffffde0;
            a._0_8_ = in_stack_fffffffffffffdd8;
            b.data = in_stack_fffffffffffffdd0;
            b._0_8_ = in_stack_fffffffffffffdc8;
            dVar15 = dist(a,b);
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
            local_1d0 = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,0,0);
            local_1d0 = (local_1d0 - *pdVar6) / dVar15;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
            local_1d8 = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,1,0);
            local_1d8 = (local_1d8 - *pdVar6) / dVar15;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
            local_1e0 = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,2,0);
            local_1e0 = (local_1e0 - *pdVar6) / dVar15;
            *(double *)((long)pSVar4 + lVar7 * 8 + -0x600) = dVar15;
            XYZ::XYZ((XYZ *)&local_198);
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
            local_148.X = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
            local_148.Y = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
            local_148.Z = *pdVar6;
            station.Y = local_148.Y;
            station.X = local_148.X;
            station.Z = local_148.Z;
            obj.Z = local_1b8.Z;
            obj.X = local_1b8.X;
            obj.Y = local_1b8.Y;
            in_stack_fffffffffffffdc8 = type.a;
            in_stack_fffffffffffffdd0 = (double *)type.b;
            in_stack_fffffffffffffdd8 = type.c;
            in_stack_fffffffffffffde0 = (double *)type.alpha;
            XYZ2NEU(station,obj,type,(XYZ *)&local_198);
            local_158 = atan(local_188 /
                             SQRT((double)local_198._0_8_ * (double)local_198._0_8_ +
                                  (double)local_198.data * (double)local_198.data));
            dVar16 = atan2((double)local_198._0_8_,(double)local_198.data);
            *(double *)((long)pSVar4 + lVar7 * 8 + -0x300) = local_158;
            *(double *)(&(pSVar4->result).ObsTime.Week + lVar7 * 2) = dVar16;
            dVar17 = Hopefield(local_158,(pSVar4->result).UserPositionBLH.H,15.0,1013.25,0.5);
            dVar16 = (pSVar4->result).UserPositionBLH.H;
            dVar15 = (*(double *)((long)&(*local_150)->clkdif + lVar10) * 299792458.0 +
                     ((*(double *)((long)(*local_e8)->psr + lVar8) * 2.54572778016316 +
                      *(double *)((long)(*local_e8)->psr + lVar8 + 8) * -1.5457277801631601) -
                     dVar15)) - local_160;
            iVar19 = local_1e8._0_4_;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_120,local_1e8._0_4_,0);
            *pdVar6 = dVar15 - (double)(~-(ulong)(5000.0 < dVar16) & (ulong)dVar17);
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,0);
            *pdVar6 = local_1d0;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,1);
            *pdVar6 = local_1d8;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,2);
            *pdVar6 = local_1e0;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,3);
            *pdVar6 = 1.0;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_110,iVar19,iVar19);
            *pdVar6 = 1.0;
            if (local_1f8.data != (double *)0x0) {
              operator_delete__(local_1f8.data);
            }
            local_1e8 = (double)CONCAT44(local_1e8._4_4_,local_1e8._0_4_ + 1);
            GPSPosAndVel = local_150;
            ppSVar12 = local_180;
          }
          uVar11 = lVar7 - 500;
          lVar13 = lVar13 + 0x18;
          lVar10 = lVar10 + 0xb8;
          lVar8 = lVar8 + 0x70;
          lVar7 = lVar7 + 1;
        } while (uVar11 < 0x1f);
      }
      if ((int)local_170 != 0) {
        uVar11 = 0xffffffffffffffff;
        lVar8 = 0x70;
        dVar16 = 1.03753785626662e-322;
        lVar10 = 0;
        lVar7 = 0;
        do {
          dVar15 = *(double *)((long)&(*ppSVar12)->n + lVar10);
          if ((dVar15 != -1.0) || (NAN(dVar15))) {
            pXVar9 = &local_1b8;
            local_158 = dVar16;
            XYZ::XYZ(&local_1b8);
            pSVar2 = *ppSVar12;
            SatPosition_00.Z = *(double *)((long)&(pSVar2->SatPosition).Z + lVar10);
            SatPosition_00._0_16_ = *(undefined1 (*) [16])((long)&(pSVar2->SatPosition).X + lVar10);
            EarthRotationFix((SPP *)pXVar9,*(double *)((long)&pSVar2->deltat + lVar10),
                             SatPosition_00,BDS,&local_1b8);
            pSVar4 = local_1a0;
            *(double *)((long)&(local_1a0->result).UserPositionXYZ.X + lVar8) = local_1b8.Z;
            pdVar6 = (double *)((long)&(local_1a0->result).ObsTime.Week + lVar8);
            *pdVar6 = local_1b8.X;
            pdVar6[1] = local_1b8.Y;
            puVar1 = (undefined8 *)((long)(*local_e0)->psr + lVar7 + -0x10);
            dVar16 = (double)puVar1[1];
            *(undefined8 *)&(local_1a0->result).ObsTime = *puVar1;
            (local_1a0->result).ObsTime.SOW = dVar16;
            local_1f8.rows = 3;
            local_1f8.cols = 1;
            pdVar6 = (double *)operator_new__(0x18);
            local_1f8.data = pdVar6;
            dVar16 = local_1b8.X;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,0,0);
            *pdVar6 = dVar16;
            dVar16 = local_1b8.Y;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,1,0);
            dVar15 = local_1b8.Z;
            *pdVar6 = dVar16;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,2,0);
            *pdVar6 = dVar15;
            a_00.data = in_stack_fffffffffffffde0;
            a_00._0_8_ = in_stack_fffffffffffffdd8;
            b_00.data = in_stack_fffffffffffffdd0;
            b_00._0_8_ = in_stack_fffffffffffffdc8;
            dVar15 = dist(a_00,b_00);
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
            local_1d0 = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,0,0);
            local_1d0 = (local_1d0 - *pdVar6) / dVar15;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
            local_1d8 = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,1,0);
            local_1d8 = (local_1d8 - *pdVar6) / dVar15;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
            local_1e0 = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()((Matrix<double,_3,_1> *)&local_1f8,2,0);
            local_1e0 = (local_1e0 - *pdVar6) / dVar15;
            (pSVar4->result).BDSDist[uVar11 + 1] = dVar15;
            XYZ::XYZ((XYZ *)&local_198);
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
            local_148.X = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
            local_148.Y = *pdVar6;
            pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
            local_148.Z = *pdVar6;
            station_00.Y = local_148.Y;
            station_00.X = local_148.X;
            station_00.Z = local_148.Z;
            obj_00.Z = local_1b8.Z;
            obj_00.X = local_1b8.X;
            obj_00.Y = local_1b8.Y;
            in_stack_fffffffffffffdc8 = type.a;
            in_stack_fffffffffffffdd0 = (double *)type.b;
            in_stack_fffffffffffffdd8 = type.c;
            in_stack_fffffffffffffde0 = (double *)type.alpha;
            XYZ2NEU(station_00,obj_00,type,(XYZ *)&local_198);
            local_88 = atan(local_188 /
                            SQRT((double)local_198._0_8_ * (double)local_198._0_8_ +
                                 (double)local_198.data * (double)local_198.data));
            dVar16 = atan2((double)local_198._0_8_,(double)local_198.data);
            (pSVar4->result).BDSelev[uVar11 + 1] = local_88;
            (pSVar4->result).BDSAzimuth[uVar11 + 1] = dVar16;
            dVar17 = Hopefield(local_88,(pSVar4->result).UserPositionBLH.H,15.0,1013.25,0.5);
            dVar16 = (pSVar4->result).UserPositionBLH.H;
            dVar18 = (*(double *)((long)&(*local_180)->clkdif + lVar10) * 299792458.0 +
                     ((*(double *)((long)(*local_e0)->psr + lVar7) * 2.943681770145979 +
                      *(double *)((long)(*local_e0)->psr + lVar7 + 8) * -1.943681770145979) - dVar15
                     )) - local_168;
            dVar15 = *(double *)(&(*BDSEph)->sys + (long)local_158 * 2);
            iVar19 = local_1e8._0_4_;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_120,local_1e8._0_4_,0);
            *pdVar6 = ((dVar15 * -7.306023042307046e+26) / 8.278839752039997e+17 + dVar18) -
                      (double)(~-(ulong)(5000.0 < dVar16) & (ulong)dVar17);
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,0);
            *pdVar6 = local_1d0;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,1);
            *pdVar6 = local_1d8;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,2);
            *pdVar6 = local_1e0;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_100,iVar19,local_178);
            *pdVar6 = 1.0;
            pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_110,iVar19,iVar19);
            *pdVar6 = 1.0;
            if (local_1f8.data != (double *)0x0) {
              operator_delete__(local_1f8.data);
            }
            local_1e8 = (double)CONCAT44(local_1e8._4_4_,local_1e8._0_4_ + 1);
            dVar16 = local_158;
            ppSVar12 = local_180;
          }
          uVar11 = uVar11 + 1;
          lVar7 = lVar7 + 0x70;
          lVar8 = lVar8 + 0x18;
          lVar10 = lVar10 + 0xb8;
          dVar16 = (double)((long)dVar16 + 0x1b);
        } while (uVar11 < 0x3f);
      }
      local_174 = 0;
      local_1b8._0_16_ = Matrix<double,_-1,_-1>::transpose(&local_100);
      local_198 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_1b8,&local_110);
      local_1f8 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_198,&local_100);
      local_a8 = Matrix<double,_-1,_-1>::inverse(&local_1f8,&local_174);
      local_b8 = Matrix<double,-1,-1>::operator*
                           ((Matrix<double,_1,_1> *)&local_a8,(Matrix<double,__1,__1> *)&local_1b8);
      local_c8 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_b8,&local_110);
      local_d8 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_c8,&local_120);
      if (local_174 != 0) {
        if ((double *)local_1b8.Y != (double *)0x0) {
          operator_delete__((void *)local_1b8.Y);
        }
        if (local_198.data != (double *)0x0) {
          operator_delete__(local_198.data);
        }
        if (local_1f8.data != (double *)0x0) {
          operator_delete__(local_1f8.data);
        }
        if (local_a8.data != (double *)0x0) {
          operator_delete__(local_a8.data);
        }
        if (local_b8.data != (double *)0x0) {
          operator_delete__(local_b8.data);
        }
        if (local_c8.data != (double *)0x0) {
          operator_delete__(local_c8.data);
        }
        if (local_110.data != (double *)0x0) {
          operator_delete__(local_110.data);
        }
        if (local_120.data != (double *)0x0) {
          operator_delete__(local_120.data);
        }
        if (local_1c8.data != (double *)0x0) {
          operator_delete__(local_1c8.data);
        }
        if (local_100.data != (double *)0x0) {
          operator_delete__(local_100.data);
        }
        if (local_d8.data != (double *)0x0) {
          operator_delete__(local_d8.data);
        }
        return 5;
      }
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_d8,0,0);
      dVar16 = *pdVar6;
      pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
      *pdVar6 = dVar16 + *pdVar6;
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_d8,1,0);
      dVar16 = *pdVar6;
      pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
      *pdVar6 = dVar16 + *pdVar6;
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_d8,2,0);
      dVar16 = *pdVar6;
      pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
      *pdVar6 = dVar16 + *pdVar6;
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_d8,3,0);
      local_160 = local_160 + *pdVar6;
      if ((int)local_170 != 0) {
        pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_d8,local_178,0);
        local_168 = local_168 + *pdVar6;
      }
      uVar11 = local_f0;
      local_40 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_100,&local_d8);
      local_50 = Matrix<double,_-1,_-1>::operator+(&local_40,&local_120);
      local_60 = Matrix<double,_-1,_-1>::transpose(&local_50);
      local_70 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_60,&local_110);
      local_80 = Matrix<double,-1,-1>::operator*((Matrix<double,_1,_1> *)&local_70,&local_50);
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_80,0,0);
      GPSPosAndVel = local_150;
      dVar16 = *pdVar6 / local_98;
      if (dVar16 < 0.0) {
        local_1e8 = sqrt(dVar16);
      }
      else {
        local_1e8 = SQRT(dVar16);
      }
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_a8,0,0);
      dVar16 = *pdVar6;
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_a8,1,1);
      dVar15 = *pdVar6;
      pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_a8,2,2);
      dVar16 = dVar16 + dVar15 + *pdVar6;
      if (dVar16 < 0.0) {
        dVar16 = sqrt(dVar16);
      }
      else {
        dVar16 = SQRT(dVar16);
      }
      (local_1a0->result).UserPositionSigma = local_1e8;
      (local_1a0->result).PDop = dVar16;
      if (local_40.data != (double *)0x0) {
        operator_delete__(local_40.data);
      }
      if (local_50.data != (double *)0x0) {
        operator_delete__(local_50.data);
      }
      if (local_60.data != (double *)0x0) {
        operator_delete__(local_60.data);
      }
      if (local_70.data != (double *)0x0) {
        operator_delete__(local_70.data);
      }
      if (local_80.data != (double *)0x0) {
        operator_delete__(local_80.data);
      }
      local_130.rows = 3;
      local_130.cols = 1;
      local_130.data = (double *)operator_new__(0x18);
      iVar19 = 0;
      do {
        pdVar6 = Matrix<double,_-1,_-1>::operator()(&local_d8,iVar19,0);
        dVar16 = *pdVar6;
        pdVar6 = Matrix<double,_3,_1>::operator()(&local_130,iVar19,0);
        *pdVar6 = dVar16;
        iVar19 = iVar19 + 1;
      } while (iVar19 < local_130.rows);
      dVar16 = Matrix<double,_3,_1>::norm(&local_130);
      if (dVar16 < 1e-05) {
        if ((double *)local_1b8.Y != (double *)0x0) {
          operator_delete__((void *)local_1b8.Y);
        }
        if (local_198.data != (double *)0x0) {
          operator_delete__(local_198.data);
        }
        if (local_1f8.data != (double *)0x0) {
          operator_delete__(local_1f8.data);
        }
        if (local_a8.data != (double *)0x0) {
          operator_delete__(local_a8.data);
        }
        if (local_b8.data != (double *)0x0) {
          operator_delete__(local_b8.data);
        }
        if (local_c8.data != (double *)0x0) {
          operator_delete__(local_c8.data);
        }
        if (local_130.data != (double *)0x0) {
          operator_delete__(local_130.data);
        }
        if (local_d8.data != (double *)0x0) {
          operator_delete__(local_d8.data);
        }
        break;
      }
      if ((double *)local_1b8.Y != (double *)0x0) {
        operator_delete__((void *)local_1b8.Y);
      }
      ppSVar12 = local_180;
      if (local_198.data != (double *)0x0) {
        operator_delete__(local_198.data);
      }
      if (local_1f8.data != (double *)0x0) {
        operator_delete__(local_1f8.data);
      }
      if (local_a8.data != (double *)0x0) {
        operator_delete__(local_a8.data);
      }
      if (local_b8.data != (double *)0x0) {
        operator_delete__(local_b8.data);
      }
      if (local_c8.data != (double *)0x0) {
        operator_delete__(local_c8.data);
      }
      if (local_130.data != (double *)0x0) {
        operator_delete__(local_130.data);
      }
      uVar5 = local_90;
      if (local_d8.data != (double *)0x0) {
        operator_delete__(local_d8.data);
      }
      uVar21 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar21;
    } while (uVar21 != 0xb);
    pSVar4 = local_1a0;
    (local_1a0->result).GPSR = local_160;
    (local_1a0->result).BDSR = local_168;
    pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,0,0);
    (pSVar4->result).UserPositionXYZ.X = *pdVar6;
    pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,1,0);
    (pSVar4->result).UserPositionXYZ.Y = *pdVar6;
    pdVar6 = Matrix<double,_3,_1>::operator()(&local_1c8,2,0);
    (pSVar4->result).UserPositionXYZ.Z = *pdVar6;
    XYZ2BLH((pSVar4->result).UserPositionXYZ,type,&(pSVar4->result).UserPositionBLH);
    XYZ::XYZ(&local_148);
    XYZ2NEU((pSVar4->result).UserRefPositionXYZ,(pSVar4->result).UserPositionXYZ,type,&local_148);
    (pSVar4->result).diffNeu.Z = local_148.Z;
    (pSVar4->result).diffNeu.X = local_148.X;
    (pSVar4->result).diffNeu.Y = local_148.Y;
    if (local_110.data != (double *)0x0) {
      operator_delete__(local_110.data);
    }
    if (local_120.data != (double *)0x0) {
      operator_delete__(local_120.data);
    }
    if (local_1c8.data != (double *)0x0) {
      operator_delete__(local_1c8.data);
    }
    if (local_100.data != (double *)0x0) {
      operator_delete__(local_100.data);
    }
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

int SPP::solveSPP(Satellite* &&GPSPosAndVel, Satellite* &&BDSPosAndVel,
                  Obs* &&GPSObs, Obs* &&BDSObs, Ephemeris* &&GPSEph,
                  Ephemeris* &&BDSEph, ELLIPSOID type)
{
    int GPSObsNum = 0, BDSObsNum = 0;
    int cols = 5;
    for(int i = 0; i < MAXGPSSRN; ++i)
        if(GPSPosAndVel[i].n != -1)
            GPSObsNum ++;
    for(int i = 0; i < MAXBDSSRN; ++i)
        if(BDSPosAndVel[i].n != -1)
            BDSObsNum ++;

    this->result.BDSObsNum = BDSObsNum;
    this->result.GPSObsNum = GPSObsNum;

    if(GPSObsNum == 0 || BDSObsNum == 0)
        cols = 4;
    if(BDSObsNum ==0 && GPSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum == 0 && BDSObsNum <= 4)
        return NOT_ENOUGH_OBS;
    if(GPSObsNum != 0 && BDSObsNum != 0 && GPSObsNum + BDSObsNum < 5)
        return NOT_ENOUGH_OBS;
    
    // 测站位置
    Vector3d RefPos;
    RefPos.Zero();
    // n * m
    MatrixXd B(BDSObsNum + GPSObsNum, cols);
    // n * n
    MatrixXd P(B.row(), B.row());
    // n * 1
    MatrixXd w(B.row(), 1);
    B.Zero();
    P.Zero();
    int count = 0;
    double GPSR = this->result.GPSR, BDSR = this->result.BDSR;
    
    while (count <= 10)
    {
        int num = 0;
        XYZ station;
        for(int prn = 0; prn < MAXGPSSRN; ++prn)
        {
            if(GPSObsNum == 0)
                break;
            if(GPSPosAndVel[prn].n == -1){
                continue;
            }
            this->result.ObsTime = GPSObs[prn].ObsTime;

            // 地球自转改正
            XYZ fix;
            EarthRotationFix(GPSPosAndVel[prn].deltat, GPSPosAndVel[prn].SatPosition, GPS, fix);
            this->result.GPSPosi[prn] = fix;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.GPSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);

            this->result.GPSelev[prn] = E;
            this->result.GPSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = GPSL1 * GPSL1 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[0] - 
                           GPSL2 * GPSL2 / (GPSL1 * GPSL1 - GPSL2 * GPSL2) * GPSObs[prn].psr[1];
            // w矩阵
            w(num, 0) = IFpsr - distance + GPSPosAndVel[prn].clkdif * LIGHTSPEED - GPSR - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            B(num, 3) = 1;

            P(num, num) = 1.0;// / pow(GPSObs[prn].psr_sigma[0] + GPSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        // BDS
        for(int prn = 0; prn < MAXBDSSRN; ++prn)
        {
            if(BDSObsNum == 0)
                break;
            if(BDSPosAndVel[prn].n == -1){
                continue;
            }
            // 几何距离
            XYZ fix;
            EarthRotationFix(BDSPosAndVel[prn].deltat, BDSPosAndVel[prn].SatPosition, BDS, fix);
            this->result.BDSPosi[prn] = fix;
            this->result.ObsTime = BDSObs[prn].ObsTime;
            Vector3d SatPos;
            SatPos(0, 0) = fix.X;
            SatPos(1, 0) = fix.Y;
            SatPos(2, 0) = fix.Z;
            double distance = dist(RefPos, SatPos);
            double l = (RefPos(0, 0) - SatPos(0, 0)) / distance;
            double m = (RefPos(1, 0) - SatPos(1, 0)) / distance;
            double n = (RefPos(2, 0) - SatPos(2, 0)) / distance;
            this->result.BDSDist[prn] = distance;

            // 对流层改正
            double T = 0;
            XYZ satNEU;
            station.X = RefPos(0, 0);
            station.Y = RefPos(1, 0);
            station.Z = RefPos(2, 0);
            XYZ2NEU(station, fix, type, satNEU);

            double E = this->CalculateEA(satNEU);
            double A = this->CalculateAzi(satNEU);
            this->result.BDSelev[prn] = E;
            this->result.BDSAzimuth[prn] = A;

            T = Hopefield(E, result.UserPositionBLH.H);
            if(result.UserPositionBLH.H > 5e3)
                T = 0;
            double IFpsr = BDSB1 * BDSB1 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[0] - 
                           BDSB3 * BDSB3 / (BDSB1 * BDSB1 - BDSB3 * BDSB3) * BDSObs[prn].psr[1];
            
            // w矩阵
            w(num, 0) = IFpsr - distance + BDSPosAndVel[prn].clkdif * LIGHTSPEED - BDSR -
                        LIGHTSPEED * BDSB1 * BDSB1 * BDSEph[prn].tgd / ((BDSB1 * BDSB1 - BDSB3 * BDSB3)) - T;
            // B矩阵
            B(num, 0) = l;
            B(num, 1) = m;
            B(num, 2) = n;
            if(GPSObsNum == 0)
                B(num, 3) = 1;
            else
                B(num, 4) = 1;

            P(num, num) = 1.0;// / pow(BDSObs[prn].psr_sigma[0] + BDSObs[prn].psr_sigma[1], 2);
            num ++;
            SatPos.deleteMatrix();
        }
        int flag = 0;
        MatrixXd B_T = B.transpose();
        MatrixXd tmp1 = B_T * P;
        MatrixXd tmp2 = tmp1 * B;
        MatrixXd tmp3 = tmp2.inverse(flag);
        MatrixXd tmp4 = tmp3 * B_T;
        MatrixXd tmp5 = tmp4 * P;
        MatrixXd v = tmp5 * w;

        if(flag != 0){
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            P.deleteMatrix();
            w.deleteMatrix();
            RefPos.deleteMatrix();
            B.deleteMatrix();
            v.deleteMatrix();
            return NOT_INVERTIBLE;
        }
        RefPos(0, 0) += v(0, 0);
        RefPos(1, 0) += v(1, 0);
        RefPos(2, 0) += v(2, 0);
        GPSR += v(3, 0);
        if(GPSObsNum == 0 && BDSObsNum != 0)
            BDSR += v(3, 0);
        else if(BDSObsNum != 0 && GPSObsNum != 0)
            BDSR += v(4, 0);

        MatrixXd tmp6 = B * v;
        MatrixXd tmp7 = tmp6 + w;
        MatrixXd tmp8 = tmp7.transpose();
        MatrixXd tmp9 = tmp8 * P;
        MatrixXd tmp10 = tmp9 * tmp7;

        int Obsnum = 5;
        if(GPSObsNum ==0 || BDSObsNum ==0)
            Obsnum = 4;
        double sigma = sqrt(tmp10(0, 0) / (BDSObsNum + GPSObsNum - Obsnum));
        double pdop = sqrt(tmp3(0, 0) + tmp3(1, 1) + tmp3(2, 2));

        result.UserPositionSigma = sigma;
        result.PDop = pdop;
        tmp6.deleteMatrix();
        tmp7.deleteMatrix();
        tmp8.deleteMatrix();
        tmp9.deleteMatrix();
        tmp10.deleteMatrix();

        Vector3d dx;
        for(int i = 0; i < dx.row(); i++)
            dx(i, 0) = v(i, 0);
        if(dx.norm() < 1e-5)
        {
            B_T.deleteMatrix();
            tmp1.deleteMatrix();
            tmp2.deleteMatrix();
            tmp3.deleteMatrix();
            tmp4.deleteMatrix();
            tmp5.deleteMatrix();
            dx.deleteMatrix();
            v.deleteMatrix();
            break;        
        }
        count ++;

        B_T.deleteMatrix();
        tmp1.deleteMatrix();
        tmp2.deleteMatrix();
        tmp3.deleteMatrix();
        tmp4.deleteMatrix();
        tmp5.deleteMatrix();
        dx.deleteMatrix();
        v.deleteMatrix();
    }
    this->result.GPSR = GPSR;
    this->result.BDSR = BDSR;
    this->result.UserPositionXYZ.X = RefPos(0, 0);
    this->result.UserPositionXYZ.Y = RefPos(1, 0);
    this->result.UserPositionXYZ.Z = RefPos(2, 0);
    XYZ2BLH(result.UserPositionXYZ, type, result.UserPositionBLH);
    XYZ NEU;
    XYZ2NEU(result.UserRefPositionXYZ, result.UserPositionXYZ, type, NEU);
    result.diffNeu = NEU;

    P.deleteMatrix();
    w.deleteMatrix();
    RefPos.deleteMatrix();
    B.deleteMatrix();
    return 0;
}